

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

Value * __thiscall Json::Value::operator[](Value *this,ArrayIndex index)

{
  map<Json::Value::CZString,Json::Value,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
  *this_00;
  reference ppVar1;
  bool bVar2;
  bool local_d1;
  const_iterator local_a8;
  _Base_ptr local_a0;
  undefined1 local_98 [8];
  value_type defaultValue;
  _Self local_68;
  _Self local_60;
  iterator it;
  CZString key;
  Value local_38;
  ArrayIndex local_1c;
  Value *pVStack_18;
  ArrayIndex index_local;
  Value *this_local;
  
  bVar2 = true;
  if ((*(ushort *)&this->field_0x8 & 0xff) != 0) {
    bVar2 = (*(ushort *)&this->field_0x8 & 0xff) == 6;
  }
  local_1c = index;
  pVStack_18 = this;
  if (bVar2) {
    if ((*(ushort *)&this->field_0x8 & 0xff) == 0) {
      Value(&local_38,arrayValue);
      operator=(this,&local_38);
      ~Value(&local_38);
    }
    CZString::CZString((CZString *)&it,local_1c);
    local_60._M_node =
         (_Base_ptr)
         std::
         map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
         ::lower_bound((this->value_).map_,(CZString *)&it);
    local_68._M_node =
         (_Base_ptr)
         std::
         map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
         ::end((this->value_).map_);
    bVar2 = std::operator!=(&local_60,&local_68);
    local_d1 = false;
    if (bVar2) {
      ppVar1 = std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::
               operator*(&local_60);
      local_d1 = CZString::operator==(&ppVar1->first,(CZString *)&it);
    }
    if (local_d1 == false) {
      std::pair<const_Json::Value::CZString,_Json::Value>::pair<Json::Value::CZString_&,_true>
                ((pair<const_Json::Value::CZString,_Json::Value> *)local_98,(CZString *)&it,
                 (Value *)null);
      this_00 = (map<Json::Value::CZString,Json::Value,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
                 *)(this->value_).map_;
      std::_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::
      _Rb_tree_const_iterator(&local_a8,&local_60);
      local_a0 = (_Base_ptr)
                 std::
                 map<Json::Value::CZString,Json::Value,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
                 ::insert<std::pair<Json::Value::CZString_const,Json::Value>&>
                           (this_00,local_a8,
                            (pair<const_Json::Value::CZString,_Json::Value> *)local_98);
      local_60._M_node = local_a0;
      ppVar1 = std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::
               operator*(&local_60);
      this_local = &ppVar1->second;
      defaultValue.second.comments_._4_4_ = 1;
      std::pair<const_Json::Value::CZString,_Json::Value>::~pair
                ((pair<const_Json::Value::CZString,_Json::Value> *)local_98);
    }
    else {
      ppVar1 = std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::
               operator*(&local_60);
      this_local = &ppVar1->second;
      defaultValue.second.comments_._4_4_ = 1;
    }
    CZString::~CZString((CZString *)&it);
    return this_local;
  }
  __assert_fail("type_ == nullValue || type_ == arrayValue",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/jsoncpp/src/lib_json/json_value.cpp"
                ,0x435,"Value &Json::Value::operator[](ArrayIndex)");
}

Assistant:

Value &
Value::operator[]( ArrayIndex index )
{
   JSON_ASSERT( type_ == nullValue  ||  type_ == arrayValue );
   if ( type_ == nullValue )
      *this = Value( arrayValue );
#ifndef JSON_VALUE_USE_INTERNAL_MAP
   CZString key( index );
   ObjectValues::iterator it = value_.map_->lower_bound( key );
   if ( it != value_.map_->end()  &&  (*it).first == key )
      return (*it).second;

   ObjectValues::value_type defaultValue( key, null );
   it = value_.map_->insert( it, defaultValue );
   return (*it).second;
#else
   return value_.array_->resolveReference( index );
#endif
}